

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bridge.cpp
# Opt level: O1

int AF_ACustomBridge_A_BridgeInit
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *pAVar1;
  VMValue *pVVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  VMValue *pVVar7;
  PClassActor *type;
  AActor *self;
  uint uVar8;
  char *pcVar9;
  uint uVar10;
  bool bVar11;
  double local_50;
  DVector3 local_40;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar1 = (AActor *)(param->field_0).field_1.a;
      if (pAVar1 != (AActor *)0x0) {
        if ((pAVar1->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(pAVar1->super_DThinker).super_DObject._vptr_DObject)(pAVar1);
          (pAVar1->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
        }
        pPVar6 = (pAVar1->super_DThinker).super_DObject.Class;
        bVar11 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar3 && bVar11) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar11 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar11) {
          pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004b4eae;
        }
      }
      if (numparam == 1) {
        pVVar2 = defaultparam->Array;
        if ((pVVar2[1].field_0.field_3.Type == '\x03') &&
           ((pVVar7 = pVVar2 + 1, pVVar2[1].field_0.field_1.atag == 1 ||
            ((pVVar7->field_0).field_1.a == (void *)0x0)))) {
LAB_004b4d7a:
          type = (PClassActor *)(pVVar7->field_0).field_1.a;
          if (type == (PClassActor *)0x0) {
            type = PClass::FindActor("BridgeBall");
          }
          uVar5 = FRandom::GenRand32(&pr_orbit);
          uVar8 = 3;
          if (pAVar1->args[2] != 0) {
            uVar8 = pAVar1->args[2];
          }
          if (0 < (int)uVar8) {
            local_50 = 0.0;
            uVar10 = uVar8;
            do {
              local_40.X = (pAVar1->__Pos).X;
              local_40.Y = (pAVar1->__Pos).Y;
              local_40.Z = (pAVar1->__Pos).Z;
              self = AActor::StaticSpawn(type,&local_40,ALLOW_REPLACE,false);
              (self->Angles).Yaw.Degrees =
                   (double)(int)(0x100 / (ulong)uVar8) * 1.40625 * local_50 +
                   (double)(uVar5 & 0xff) * 1.40625;
              (self->target).field_0.p = pAVar1;
              BridgeOrbit(self);
              local_50 = local_50 + 1.0;
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
          }
          return 0;
        }
        pcVar9 = 
        "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
        ;
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((pVVar7 = param + 1, param[1].field_0.field_1.atag == 1 ||
            ((pVVar7->field_0).field_1.a == (void *)0x0)))) goto LAB_004b4d7a;
        pcVar9 = 
        "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
        ;
      }
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_bridge.cpp"
                    ,0x80,
                    "int AF_ACustomBridge_A_BridgeInit(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_004b4eae:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_bridge.cpp"
                ,0x7f,
                "int AF_ACustomBridge_A_BridgeInit(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(ACustomBridge, A_BridgeInit)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS_DEF(balltype, AActor);

	AActor *ball;

	if (balltype == NULL)
	{
		balltype = PClass::FindActor("BridgeBall");
	}

	DAngle startangle = pr_orbit() * (360./256.);

	// Spawn triad into world -- may be more than a triad now.
	int ballcount = self->args[2]==0 ? 3 : self->args[2];

	for (int i = 0; i < ballcount; i++)
	{
		ball = Spawn(balltype, self->Pos(), ALLOW_REPLACE);
		ball->Angles.Yaw = startangle + (45./32) * (256/ballcount) * i;
		ball->target = self;
		BridgeOrbit(ball);
	}
	return 0;
}